

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O2

bool __thiscall flexbuffers::Reference::MutateFloat(Reference *this,double d)

{
  bool bVar1;
  uint8_t *dest;
  long lStack_20;
  
  if (this->type_ == FBT_INDIRECT_FLOAT) {
    dest = Indirect(this);
    lStack_20 = 9;
  }
  else {
    if (this->type_ != FBT_FLOAT) {
      return false;
    }
    dest = this->data_;
    lStack_20 = 8;
  }
  bVar1 = MutateF<double>(this,dest,d,(ulong)*(byte *)((long)&this->data_ + lStack_20),
                          -(uint)((double)(float)d == d) & BIT_WIDTH_16 ^ BIT_WIDTH_64);
  return bVar1;
}

Assistant:

bool MutateFloat(double d) {
    if (type_ == FBT_FLOAT) {
      return MutateF(data_, d, parent_width_, WidthF(d));
    } else if (type_ == FBT_INDIRECT_FLOAT) {
      return MutateF(Indirect(), d, byte_width_, WidthF(d));
    } else {
      return false;
    }
  }